

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFMatrix.cpp
# Opt level: O0

bool __thiscall PDFMatrix::operator==(PDFMatrix *this,PDFMatrix *inOther)

{
  bool local_19;
  PDFMatrix *inOther_local;
  PDFMatrix *this_local;
  
  local_19 = false;
  if ((this->a == inOther->a) && (!NAN(this->a) && !NAN(inOther->a))) {
    local_19 = false;
    if ((this->b == inOther->b) && (!NAN(this->b) && !NAN(inOther->b))) {
      local_19 = false;
      if ((this->c == inOther->c) && (!NAN(this->c) && !NAN(inOther->c))) {
        local_19 = false;
        if ((this->d == inOther->d) && (!NAN(this->d) && !NAN(inOther->d))) {
          local_19 = false;
          if ((this->e == inOther->e) && (!NAN(this->e) && !NAN(inOther->e))) {
            local_19 = this->f == inOther->f;
          }
        }
      }
    }
  }
  return local_19;
}

Assistant:

bool PDFMatrix::operator==(const PDFMatrix& inOther) const {
    return a == inOther.a &&
        b == inOther.b &&
        c == inOther.c &&
        d == inOther.d &&
        e == inOther.e &&
        f == inOther.f;
}